

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

int __thiscall google::protobuf::FileOptions::ByteSize(FileOptions *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Type *value;
  uint uVar6;
  int i;
  int iVar7;
  
  uVar5 = this->_has_bits_[0];
  iVar7 = 0;
  if ((char)uVar5 == '\0') {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if ((uVar5 & 1) != 0) {
      iVar3 = internal::WireFormatLite::StringSize(this->java_package_);
      iVar3 = iVar3 + 1;
      uVar5 = this->_has_bits_[0];
    }
    if ((uVar5 & 2) != 0) {
      iVar4 = internal::WireFormatLite::StringSize(this->java_outer_classname_);
      iVar3 = iVar3 + iVar4 + 1;
      uVar5 = this->_has_bits_[0];
    }
    uVar6 = uVar5 >> 1 & 2;
    uVar2 = uVar6 + 3;
    if ((uVar5 & 8) == 0) {
      uVar2 = uVar6;
    }
    iVar3 = uVar2 + iVar3;
    if ((uVar5 & 0x10) != 0) {
      iVar4 = io::CodedOutputStream::VarintSize32SignExtended(this->optimize_for_);
      iVar3 = iVar3 + iVar4 + 1;
      uVar5 = this->_has_bits_[0];
    }
    if ((uVar5 & 0x20) != 0) {
      iVar4 = internal::WireFormatLite::StringSize(this->go_package_);
      iVar3 = iVar3 + iVar4 + 1;
      uVar5 = this->_has_bits_[0];
    }
    iVar4 = iVar3 + 3;
    if ((uVar5 & 0x40) == 0) {
      iVar4 = iVar3;
    }
    iVar3 = iVar4 + 3;
    if (-1 < (char)uVar5) {
      iVar3 = iVar4;
    }
  }
  iVar4 = iVar3 + 3;
  if ((uVar5 >> 8 & 1) == 0) {
    iVar4 = iVar3;
  }
  iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar3 * 2;
  for (; iVar7 < iVar3; iVar7 = iVar7 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar7);
    iVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value);
    iVar4 = iVar4 + iVar3;
    iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar7 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar7 = iVar7 + iVar4;
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar3 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar7 = iVar7 + iVar3;
  }
  this->_cached_size_ = iVar7;
  return iVar7;
}

Assistant:

int FileOptions::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string java_package = 1;
    if (has_java_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_package());
    }

    // optional string java_outer_classname = 8;
    if (has_java_outer_classname()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_outer_classname());
    }

    // optional bool java_multiple_files = 10 [default = false];
    if (has_java_multiple_files()) {
      total_size += 1 + 1;
    }

    // optional bool java_generate_equals_and_hash = 20 [default = false];
    if (has_java_generate_equals_and_hash()) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if (has_optimize_for()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->optimize_for());
    }

    // optional string go_package = 11;
    if (has_go_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->go_package());
    }

    // optional bool cc_generic_services = 16 [default = false];
    if (has_cc_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool java_generic_services = 17 [default = false];
    if (has_java_generic_services()) {
      total_size += 2 + 1;
    }

  }
  if (_has_bits_[8 / 32] & (0xffu << (8 % 32))) {
    // optional bool py_generic_services = 18 [default = false];
    if (has_py_generic_services()) {
      total_size += 2 + 1;
    }

  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}